

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_mul_v_uint64_256_1216(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  uint w;
  int iVar1;
  ulong uVar2;
  uint i_1;
  mzd_local_t *pmVar3;
  long lVar4;
  uint i;
  int iVar5;
  ulong uVar6;
  uint i_2;
  mzd_local_t *pmVar7;
  uint j;
  long lVar8;
  
  iVar1 = 4;
  c[2].w64[3] = 0;
  c[3].w64[0] = 0;
  c[3].w64[1] = 0;
  c[3].w64[2] = 0;
  c[3].w64[3] = 0;
  c[4].w64[0] = 0;
  c[4].w64[1] = 0;
  c[4].w64[2] = 0;
  c[2].w64[0] = 0;
  c[2].w64[1] = 0;
  c[2].w64[2] = 0;
  c[2].w64[3] = 0;
  c[3].w64[0] = 0;
  c[3].w64[1] = 0;
  c[3].w64[2] = 0;
  c[3].w64[3] = 0;
  c->w64[0] = 0;
  c->w64[1] = 0;
  c->w64[2] = 0;
  c->w64[3] = 0;
  c[1].w64[0] = 0;
  c[1].w64[1] = 0;
  c[1].w64[2] = 0;
  c[1].w64[3] = 0;
  do {
    uVar2 = v->w64[0];
    iVar5 = 0x40;
    do {
      lVar8 = 0;
      uVar6 = -(ulong)((uint)uVar2 & 1);
      pmVar7 = c;
      do {
        pmVar3 = A;
        lVar4 = 0;
        do {
          pmVar7->w64[lVar4] = pmVar7->w64[lVar4] ^ pmVar3->w64[lVar4] & uVar6;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        lVar8 = lVar8 + 1;
        pmVar7 = pmVar7 + 1;
        A = pmVar3 + 1;
      } while (lVar8 != 4);
      lVar8 = 0;
      do {
        c[4].w64[lVar8] = c[4].w64[lVar8] ^ pmVar3[1].w64[lVar8] & uVar6;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      uVar2 = uVar2 >> 1;
      A = pmVar3 + 2;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    v = (mzd_local_t *)((long)v + 8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void mzd_mul_v_uint64_256_1216(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  clear_uint64_blocks(BLOCK(c, 0), 4);
  clear_uint64_block(BLOCK(c, 4), 3);

  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      for (unsigned int j = 0; j < 4; ++j, ++Ablock) {
        mzd_xor_mask_uint64_block(BLOCK(c, j), Ablock, mask, 4);
      }
      mzd_xor_mask_uint64_block(BLOCK(c, 4), Ablock, mask, 3);
    }
  }
}